

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode deflate_do_init(Curl_easy *data,Curl_cwriter *writer)

{
  int iVar1;
  CURLcode CVar2;
  
  writer[3].next = (Curl_cwriter *)zalloc_cb;
  writer[3].ctx = zfree_cb;
  iVar1 = inflateInit_(&writer[1].next,"1.2.11",0x70);
  if (iVar1 == 0) {
    *(undefined4 *)&writer[1].cwt = 1;
    CVar2 = CURLE_OK;
  }
  else {
    process_zlib_error(data,(z_stream *)&writer[1].next);
    CVar2 = CURLE_BAD_CONTENT_ENCODING;
  }
  return CVar2;
}

Assistant:

static CURLcode deflate_do_init(struct Curl_easy *data,
                                    struct Curl_cwriter *writer)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(inflateInit(z) != Z_OK)
    return process_zlib_error(data, z);
  zp->zlib_init = ZLIB_INIT;
  return CURLE_OK;
}